

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O1

void ut::are_equal<unsigned_short,48ul,std::vector<unsigned_short,std::allocator<unsigned_short>>>
               (unsigned_short (*expected) [48],
               vector<unsigned_short,_std::allocator<unsigned_short>_> *actual,
               LocationInfo *location)

{
  pointer __s2;
  int iVar1;
  FailedAssertion *pFVar2;
  string local_40;
  
  __s2 = (actual->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if ((long)(actual->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)__s2 != 0x60) {
    pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Values are not equal!","");
    FailedAssertion::FailedAssertion(pFVar2,&local_40,location);
    __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  iVar1 = bcmp(expected,__s2,0x60);
  if (iVar1 == 0) {
    return;
  }
  pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Value is not \'true\'!","");
  FailedAssertion::FailedAssertion(pFVar2,&local_40,location);
  __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}